

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UChar32 utext_current32_63(UText *ut)

{
  UChar UVar1;
  int64_t iVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  iVar6 = ut->chunkOffset;
  if (iVar6 == ut->chunkLength) {
    UVar3 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01');
    if (UVar3 == '\0') {
      return -1;
    }
    iVar6 = ut->chunkOffset;
  }
  UVar1 = ut->chunkContents[iVar6];
  uVar5 = (uint)(ushort)UVar1;
  if ((uVar5 & 0xfc00) == 0xd800) {
    if (iVar6 + 1 < ut->chunkLength) {
      uVar7 = (uint)(ushort)ut->chunkContents[iVar6 + 1];
    }
    else {
      iVar2 = ut->chunkNativeLimit;
      UVar3 = (*ut->pFuncs->access)(ut,iVar2,'\x01');
      if (UVar3 == '\0') {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)(ushort)ut->chunkContents[ut->chunkOffset];
      }
      UVar3 = (*ut->pFuncs->access)(ut,iVar2,'\0');
      ut->chunkOffset = iVar6;
      if (UVar3 == '\0') {
        return -1;
      }
    }
    uVar4 = uVar5 * 0x400 + -0x35fdc00 + uVar7;
    if ((uVar7 & 0xfc00) != 0xdc00) {
      uVar4 = uVar5;
    }
  }
  else {
    uVar4 = (uint)(ushort)UVar1;
  }
  return uVar4;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_current32(UText *ut) {
    UChar32  c;
    if (ut->chunkOffset==ut->chunkLength) {
        // Current position is just off the end of the chunk.
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            // Off the end of the text.
            return U_SENTINEL;
        }
    }

    c = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_LEAD(c) == FALSE) {
        // Normal, non-supplementary case.
        return c;
    }

    //
    //  Possible supplementary char.
    //
    UChar32   trail = 0;
    UChar32   supplementaryC = c;
    if ((ut->chunkOffset+1) < ut->chunkLength) {
        // The trail surrogate is in the same chunk.
        trail = ut->chunkContents[ut->chunkOffset+1];
    } else {
        //  The trail surrogate is in a different chunk.
        //     Because we must maintain the iteration position, we need to switch forward
        //     into the new chunk, get the trail surrogate, then revert the chunk back to the
        //     original one.
        //     An edge case to be careful of:  the entire text may end with an unpaired
        //        leading surrogate.  The attempt to access the trail will fail, but
        //        the original position before the unpaired lead still needs to be restored.
        int64_t  nativePosition = ut->chunkNativeLimit;
        int32_t  originalOffset = ut->chunkOffset;
        if (ut->pFuncs->access(ut, nativePosition, TRUE)) {
            trail = ut->chunkContents[ut->chunkOffset];
        }
        UBool r = ut->pFuncs->access(ut, nativePosition, FALSE);  // reverse iteration flag loads preceding chunk
        U_ASSERT(r==TRUE);
        ut->chunkOffset = originalOffset;
        if(!r) {
            return U_SENTINEL;
        }
    }

    if (U16_IS_TRAIL(trail)) {
        supplementaryC = U16_GET_SUPPLEMENTARY(c, trail);
    }
    return supplementaryC;

}